

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrFreeWorldMeshBufferML
                   (XrWorldMeshDetectorML detector,XrWorldMeshBufferML *buffer)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrWorldMeshDetectorML_T_*>::getWithInstanceInfo
                    (&g_worldmeshdetectorml_info,detector);
  XVar1 = (*(pVar2.second)->dispatch_table->FreeWorldMeshBufferML)(detector,buffer);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrFreeWorldMeshBufferML(
    XrWorldMeshDetectorML detector,
    const XrWorldMeshBufferML* buffer) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_worldmeshdetectorml_info.getWithInstanceInfo(detector);
        GenValidUsageXrHandleInfo *gen_worldmeshdetectorml_info = info_with_instance.first;
        (void)gen_worldmeshdetectorml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->FreeWorldMeshBufferML(detector, buffer);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}